

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O0

void __thiscall egc::Sequencer::TS(Sequencer *this,unsigned_short instruction)

{
  ushort address;
  unsigned_short uVar1;
  unsigned_short word;
  ostream *poVar2;
  element_type *peVar3;
  element_type *peVar4;
  unsigned_short overflow_1;
  unsigned_short a;
  unsigned_short overflow;
  unsigned_short k;
  unsigned_short instruction_local;
  Sequencer *this_local;
  
  address = instruction & 0x3ff;
  poVar2 = std::operator<<((ostream *)&std::cout,"TS");
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::oct);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,address);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (address == 0) {
    peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    uVar1 = Memory::GetAccumulatorOverflow(peVar3);
    if (uVar1 != 0) {
      peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      peVar4 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      uVar1 = Memory::Read(peVar4,5,0);
      Memory::Write(peVar3,5,uVar1 + 1);
    }
  }
  else {
    peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    uVar1 = Memory::Read(peVar3,0,0);
    peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    word = Memory::GetAccumulatorOverflow(peVar3);
    peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    Memory::Write(peVar3,address,uVar1);
    if (word == 0) {
      peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Memory::Write(peVar3,0,uVar1);
    }
    else {
      peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      Memory::Write(peVar3,0,word);
      peVar3 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      peVar4 = std::__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<egc::Memory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      uVar1 = Memory::Read(peVar4,5,0);
      Memory::Write(peVar3,5,uVar1 + 1);
    }
  }
  return;
}

Assistant:

void egc::Sequencer::TS (unsigned short instruction)
{
    unsigned short k = instruction & 001777u;

    std::cout << "TS" << " " << std::oct << k << std::dec << std::endl;

    if (k == 000000u) // OVSK
    {
        auto overflow = m_Memory->GetAccumulatorOverflow();

        if (overflow)
        {
            m_Memory->Write(00005u, m_Memory->Read(00005u) + 000001u);
        }
    }
    else
    {
        auto a = m_Memory->Read(00000u);

        auto overflow = m_Memory->GetAccumulatorOverflow();

        m_Memory->Write(k, a);

        if (overflow)
        {
            m_Memory->Write(00000u, overflow);
            m_Memory->Write(00005u, m_Memory->Read(00005u) + 000001u);
        }
        else
        {
            m_Memory->Write(00000u, a);
        }
    }
}